

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void crnlib::vector<crnlib::dxt_hc::tile_details>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  uint in_EDX;
  long in_RSI;
  tile_details *pDst;
  tile_details *pSrc_end;
  tile_details *pSrc;
  undefined8 local_20;
  
  for (local_20 = in_RSI; local_20 != in_RSI + (ulong)in_EDX * 0x48; local_20 = local_20 + 0x48) {
    dxt_hc::tile_details::tile_details(pSrc_end,pDst);
    dxt_hc::tile_details::~tile_details((tile_details *)0x2024a0);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num) {
    T* pSrc = static_cast<T*>(pSrc_void);
    T* const pSrc_end = pSrc + num;
    T* pDst = static_cast<T*>(pDst_void);

    while (pSrc != pSrc_end) {
      // placement new
      new (static_cast<void*>(pDst)) T(*pSrc);
      pSrc->~T();
      ++pSrc;
      ++pDst;
    }
  }